

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# as-02-info.cpp
# Opt level: O0

FileInfoWrapper<AS_02::IAB::MXFReader,_MyIabDescriptor> * __thiscall
FileInfoWrapper<AS_02::IAB::MXFReader,_MyIabDescriptor>::file_info
          (FileInfoWrapper<AS_02::IAB::MXFReader,_MyIabDescriptor> *this,CommandOptions *Options,
          char *type_string,FILE *stream)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  char *pcVar4;
  FILE *in_R8;
  char *pcVar5;
  ui64_t container_duration;
  undefined1 local_a0 [120];
  FILE *stream_local;
  char *type_string_local;
  CommandOptions *Options_local;
  FileInfoWrapper<AS_02::IAB::MXFReader,_MyIabDescriptor> *this_local;
  Result_t *result;
  
  stream_local = stream;
  type_string_local = type_string;
  Options_local = Options;
  this_local = this;
  if (stream == (FILE *)0x0) {
    __assert_fail("type_string",
                  "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/as-02-info.cpp"
                  ,0x308,
                  "Result_t FileInfoWrapper<AS_02::IAB::MXFReader, MyIabDescriptor>::file_info(CommandOptions &, const char *, FILE *) [ReaderT = AS_02::IAB::MXFReader, DescriptorT = MyIabDescriptor]"
                 );
  }
  local_a0._112_8_ = in_R8;
  if (in_R8 == (FILE *)0x0) {
    local_a0._112_8_ = _stdout;
  }
  local_a0[0x6f] = '\0';
  Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_OK);
  OpenRead((FileInfoWrapper<AS_02::IAB::MXFReader,_MyIabDescriptor> *)local_a0,(MXFReader *)Options,
           (CommandOptions *)&Options->filenames);
  Kumu::Result_t::operator=((Result_t *)this,(Result_t *)local_a0);
  Kumu::Result_t::~Result_t((Result_t *)local_a0);
  iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
  if (iVar2 < 0) {
    bVar1 = Kumu::Result_t::operator==((Result_t *)this,(Result_t *)ASDCP::RESULT_FORMAT);
    if ((bVar1) && ((type_string_local[0x21] & 1U) != 0)) {
      AS_02::IAB::MXFReader::DumpHeaderMetadata((_IO_FILE *)&Options->filenames);
    }
  }
  else {
    MyIabDescriptor::FillDescriptor
              ((MyIabDescriptor *)
               &Options[1].filenames.
                super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl._M_node._M_size,(MXFReader *)&Options->filenames);
    AS_02::IAB::MXFReader::FillWriterInfo((WriterInfo *)&container_duration);
    Kumu::Result_t::~Result_t((Result_t *)&container_duration);
    lVar3 = (long)(int)Options[1].filenames.
                       super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl._M_node._M_size;
    pcVar4 = "Unknown";
    if (*(int *)&Options[5].filenames.
                 super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl._M_node.super__List_node_base._M_next == 2) {
      pcVar4 = "SMPTE 2067-5";
    }
    pcVar5 = "s";
    if (lVar3 == 1) {
      pcVar5 = "";
    }
    fprintf(_stdout,"%s file essence type is %s, (%llu edit unit%s).\n",pcVar4,stream_local,lVar3,
            pcVar5);
    if ((type_string_local[0x21] & 1U) != 0) {
      AS_02::IAB::MXFReader::DumpHeaderMetadata((_IO_FILE *)&Options->filenames);
    }
    if ((type_string_local[0x22] & 1U) != 0) {
      ASDCP::WriterInfoDump((WriterInfo *)&Options[1].showindex_flag,(_IO_FILE *)local_a0._112_8_);
    }
    if ((type_string_local[0x23] & 1U) != 0) {
      MyIabDescriptor::MyDump
                ((MyIabDescriptor *)
                 &Options[1].filenames.
                  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl._M_node._M_size,(FILE *)local_a0._112_8_);
    }
    if ((type_string_local[0x20] & 1U) != 0) {
      AS_02::IAB::MXFReader::DumpIndex((_IO_FILE *)&Options->filenames);
    }
  }
  return this;
}

Assistant:

Result_t
  file_info(CommandOptions& Options, const char* type_string, FILE* stream = 0)
  {
    assert(type_string);
    if ( stream == 0 )
      {
	stream = stdout;
      }

    Result_t result = RESULT_OK;
    result = OpenRead(m_Reader, Options);

    if ( ASDCP_SUCCESS(result) )
      {
	m_Desc.FillDescriptor(m_Reader);
	m_Reader.FillWriterInfo(m_WriterInfo);
        ui64_t container_duration = m_Desc.ContainerDuration;
	fprintf(stdout, "%s file essence type is %s, (%llu edit unit%s).\n",
		( m_WriterInfo.LabelSetType == LS_MXF_SMPTE ? "SMPTE 2067-5" : "Unknown" ),
		type_string,
		container_duration,
		(container_duration == ui64_C(1) ? "":"s"));

	if ( Options.showheader_flag )
	  {
	    m_Reader.DumpHeaderMetadata(stream);
	  }

	if ( Options.showid_flag )
	  {
	    WriterInfoDump(m_WriterInfo, stream);
	  }

	if ( Options.showdescriptor_flag )
	  {
	    m_Desc.MyDump(stream);
	  }

	if ( Options.showindex_flag )
	  {
	    m_Reader.DumpIndex(stream);
	  }
      }
    else if ( result == RESULT_FORMAT && Options.showheader_flag )
      {
	m_Reader.DumpHeaderMetadata(stream);
      }

    return result;
  }